

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O2

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Matrix<float,3,3,0,3,3>,Eigen::Product<Eigen::Matrix<float,3,3,0,3,3>,Eigen::Transpose<Eigen::Matrix<float,3,3,0,3,3>const>,1>,Eigen::internal::assign_op<float,float>>
               (Matrix<float,_3,_3,_0,_3,_3> *dst,
               Product<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_Eigen::Transpose<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_1>
               *src,assign_op<float,_float> *func)

{
  DstEvaluatorType dstEvaluator;
  Kernel kernel;
  SrcEvaluatorType srcEvaluator;
  DstEvaluatorType local_50;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_Eigen::Transpose<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_1>_>,_Eigen::internal::assign_op<float,_float>,_0>
  local_48;
  SrcEvaluatorType local_28;
  
  local_28.
  super_product_evaluator<Eigen::Product<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_Eigen::Transpose<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
  .m_lhs = src->m_lhs;
  local_48.m_src = &local_28;
  local_28.
  super_product_evaluator<Eigen::Product<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_Eigen::Transpose<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
  .m_rhs.m_matrix = (src->m_rhs).m_matrix;
  local_28.
  super_product_evaluator<Eigen::Product<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_Eigen::Transpose<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
  .m_innerDim = 3;
  local_48.m_dst = &local_50;
  local_50.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>.m_d.data =
       (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>)
       (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>)dst;
  local_48.m_functor = func;
  local_48.m_dstExpr = dst;
  local_28.
  super_product_evaluator<Eigen::Product<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_Eigen::Transpose<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
  .m_lhsImpl.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>.m_d.data
       = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>)
         (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>)
         local_28.
         super_product_evaluator<Eigen::Product<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_Eigen::Transpose<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
         .m_lhs;
  local_28.
  super_product_evaluator<Eigen::Product<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_Eigen::Transpose<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
  .m_rhsImpl.
  super_unary_evaluator<Eigen::Transpose<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::internal::IndexBased,_float>
  .m_argImpl.super_evaluator<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>.m_d.data =
       (unary_evaluator<Eigen::Transpose<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::internal::IndexBased,_float>
        )(unary_evaluator<Eigen::Transpose<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::internal::IndexBased,_float>
          )local_28.
           super_product_evaluator<Eigen::Product<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_Eigen::Transpose<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
           .m_rhs.m_matrix;
  copy_using_evaluator_DefaultTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_Eigen::Transpose<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_1>_>,_Eigen::internal::assign_op<float,_float>,_0>,_0,_9>
  ::run(&local_48);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);

  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}